

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O3

ResultT * __thiscall
dg::AllMaxPath::compute(ResultT *__return_storage_ptr__,AllMaxPath *this,CDGraph *graph)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  long lVar3;
  long lVar4;
  mapped_type *__args_1;
  CDGraph *__range2;
  pointer puVar5;
  __hashtable *__this;
  double dVar6;
  undefined1 auVar7 [16];
  ContainedType *nd;
  _Head_base<0UL,_dg::CDNode_*,_false> local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar3 = (long)(graph->_nodes).
                super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(graph->_nodes).
                super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = lVar3 >> 3;
  auVar7._8_4_ = (int)(lVar3 >> 0x23);
  auVar7._0_8_ = lVar4;
  auVar7._12_4_ = 0x45300000;
  dVar6 = ceil(((auVar7._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) /
               (double)(this->data)._M_h._M_rehash_policy._M_max_load_factor);
  std::
  _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash((_Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            *)this,(long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6);
  puVar2 = (graph->_nodes).
           super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (graph->_nodes).
                super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    local_38._M_head_impl =
         (puVar5->_M_t).super___uniq_ptr_impl<dg::CDNode,_std::default_delete<dg::CDNode>_>._M_t.
         super__Tuple_impl<0UL,_dg::CDNode_*,_std::default_delete<dg::CDNode>_>.
         super__Head_base<0UL,_dg::CDNode_*,_false>._M_head_impl;
    compute(this,graph,local_38._M_head_impl);
    __args_1 = std::__detail::
               _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,&local_38._M_head_impl);
    std::
    _Rb_tree<dg::CDNode*,std::pair<dg::CDNode*const,dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&>,std::_Select1st<std::pair<dg::CDNode*const,dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&>>>
    ::
    _M_emplace_unique<dg::CDNode*&,dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>&>
              ((_Rb_tree<dg::CDNode*,std::pair<dg::CDNode*const,dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&>,std::_Select1st<std::pair<dg::CDNode*const,dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&>>>
                *)__return_storage_ptr__,&local_38._M_head_impl,&__args_1->colors);
  }
  return __return_storage_ptr__;
}

Assistant:

ResultT compute(CDGraph &graph) {
        ResultT res;

        data.reserve(graph.size());

        for (auto *nd : graph) {
            compute(graph, nd);
            res.emplace(nd, data[nd].colors);
        }

        return res;
    }